

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::begin_object
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,item_event_visitor *visitor,uint8_t type,error_code *ec)

{
  int iVar1;
  size_t length;
  parse_mode local_24;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  if (iVar1 < *(int *)((this->options_)._vptr_msgpack_decode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_msgpack_decode_options)) {
    length = get_size(this,type,ec);
    if (this->more_ == true) {
      local_24 = map_key;
      std::vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>::
      emplace_back<jsoncons::msgpack::parse_mode,unsigned_long&>
                ((vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>
                  *)&this->state_stack_,&local_24,&length);
      (*visitor->_vptr_basic_item_event_visitor[4])(visitor,length,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
    }
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
    this->more_ = false;
  }
  return;
}

Assistant:

void begin_object(item_event_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = msgpack_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        std::size_t length = get_size(type, ec);
        if (!more_)
        {
            return;
        }
        state_stack_.emplace_back(parse_mode::map_key,length);
        visitor.begin_object(length, semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
    }